

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O3

void __thiscall
soul::ArrayWithPreallocation<soul::CodeLocation,_4UL>::push_back
          (ArrayWithPreallocation<soul::CodeLocation,_4UL> *this,CodeLocation *item)

{
  CodeLocation *pCVar1;
  size_t sVar2;
  SourceCodeText *pSVar3;
  
  reserve(this,this->numActive + 1);
  pCVar1 = this->items;
  sVar2 = this->numActive;
  pSVar3 = (item->sourceCode).object;
  pCVar1[sVar2].sourceCode.object = pSVar3;
  if (pSVar3 != (SourceCodeText *)0x0) {
    (pSVar3->super_RefCountedObject).refCount = (pSVar3->super_RefCountedObject).refCount + 1;
  }
  pCVar1[sVar2].location.data = (item->location).data;
  this->numActive = sVar2 + 1;
  return;
}

Assistant:

void push_back (const Item& item)                       { reserve (numActive + 1); new (items + numActive) Item (item); ++numActive; }